

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O2

void mpp_writer_put_ue(MppWriteCtx *ctx,RK_U32 val)

{
  uint uVar1;
  uint val_00;
  uint uVar2;
  uint uVar3;
  
  val_00 = val + 1;
  uVar1 = 0xffffffff;
  uVar2 = 0xffffffe7;
  do {
    uVar3 = uVar2;
    uVar1 = uVar1 + 2;
    uVar2 = uVar3 + 1;
  } while (val_00 >> ((char)uVar3 + 0x1aU & 0x1f) != 0);
  uVar2 = uVar3 + 0x1a;
  if (0xc < uVar2) {
    uVar1 = uVar3 + 0x19;
    if (0x18 < uVar3 + 0x19) {
      mpp_writer_put_bits(ctx,0,0x18);
      uVar1 = uVar3 + 1;
    }
    mpp_writer_put_bits(ctx,0,uVar1);
    uVar1 = uVar2;
    if (0x18 < uVar2) {
      uVar1 = uVar3 + 2;
      val_00 = val_00 >> ((byte)uVar1 & 0x1f);
      mpp_writer_put_bits(ctx,val_00,0x18);
    }
  }
  mpp_writer_put_bits(ctx,val_00,uVar1);
  return;
}

Assistant:

void mpp_writer_put_ue(MppWriteCtx *ctx, RK_U32 val)
{
    RK_U32 num_bits = 0;

    val++;
    while (val >> ++num_bits);

    if (num_bits > 12) {
        RK_U32 tmp;

        tmp = num_bits - 1;

        if (tmp > 24) {
            tmp -= 24;
            mpp_writer_put_bits(ctx, 0, 24);
        }

        mpp_writer_put_bits(ctx, 0, tmp);

        if (num_bits > 24) {
            num_bits -= 24;
            mpp_writer_put_bits(ctx, val >> num_bits, 24);
            val = val >> num_bits;
        }

        mpp_writer_put_bits(ctx, val, num_bits);
    } else {
        mpp_writer_put_bits(ctx, val, 2 * num_bits - 1);
    }
}